

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_axi.c
# Opt level: O3

REF_STATUS ref_axi_wedge(REF_GRID ref_grid)

{
  double dVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_CELL pRVar3;
  REF_GRID pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  void *__ptr;
  long lVar7;
  undefined8 uVar8;
  REF_GLOB global;
  long lVar9;
  char *pcVar10;
  REF_INT RVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  REF_INT nunique;
  REF_INT pri_nodes [8];
  REF_INT new_nodes [8];
  REF_INT new_cell;
  REF_INT pyr_nodes [8];
  REF_INT nodes [8];
  REF_INT unique [8];
  int local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_e8 [11];
  REF_INT local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  REF_GRID local_90;
  REF_INT local_88 [10];
  long local_60;
  REF_INT local_58 [10];
  
  ref_node = ref_grid->node;
  uVar5 = ref_node->n;
  local_90 = ref_grid;
  if ((long)(int)uVar5 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",0x31,
           "ref_axi_wedge","malloc o2n of REF_INT negative");
LAB_0010fd6a:
    uVar5 = 1;
  }
  else {
    __ptr = malloc((long)(int)uVar5 * 4);
    auVar16 = _DAT_001ff260;
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",0x31,
             "ref_axi_wedge","malloc o2n of REF_INT NULL");
      uVar5 = 2;
    }
    else {
      if (uVar5 != 0) {
        lVar7 = (ulong)uVar5 - 1;
        auVar15._8_4_ = (int)lVar7;
        auVar15._0_8_ = lVar7;
        auVar15._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar7 = 0;
        auVar15 = auVar15 ^ _DAT_001ff260;
        auVar17 = _DAT_001ff240;
        auVar18 = _DAT_001ff250;
        do {
          auVar19 = auVar18 ^ auVar16;
          iVar12 = auVar15._4_4_;
          if ((bool)(~(auVar19._4_4_ == iVar12 && auVar15._0_4_ < auVar19._0_4_ ||
                      iVar12 < auVar19._4_4_) & 1)) {
            *(undefined4 *)((long)__ptr + lVar7) = 0xffffffff;
          }
          if ((auVar19._12_4_ != auVar15._12_4_ || auVar19._8_4_ <= auVar15._8_4_) &&
              auVar19._12_4_ <= auVar15._12_4_) {
            *(undefined4 *)((long)__ptr + lVar7 + 4) = 0xffffffff;
          }
          auVar19 = auVar17 ^ auVar16;
          iVar20 = auVar19._4_4_;
          if (iVar20 <= iVar12 && (iVar20 != iVar12 || auVar19._0_4_ <= auVar15._0_4_)) {
            *(undefined4 *)((long)__ptr + lVar7 + 8) = 0xffffffff;
            *(undefined4 *)((long)__ptr + lVar7 + 0xc) = 0xffffffff;
          }
          lVar13 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 4;
          auVar18._8_8_ = lVar13 + 4;
          lVar13 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 4;
          auVar17._8_8_ = lVar13 + 4;
          lVar7 = lVar7 + 0x10;
        } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar7);
      }
      iVar12 = ref_node->max;
      if (0 < iVar12) {
        local_60 = ref_node->old_n_global / 2;
        lVar13 = 1;
        lVar7 = 0;
        lVar14 = 0;
        do {
          lVar9 = ref_node->global[lVar14];
          if (lVar9 < 0) {
            lVar9 = (long)iVar12;
          }
          else {
            dVar1 = ref_node->real[lVar13 + 1];
            if (dVar1 <= -dVar1) {
              dVar1 = -dVar1;
            }
            RVar11 = (REF_INT)lVar14;
            if (1e-06 <= dVar1) {
LAB_0010fc87:
              *(REF_INT *)((long)__ptr + lVar14 * 4) = RVar11;
            }
            else {
              dVar1 = ref_node->real[lVar13];
              if (dVar1 <= -dVar1) {
                dVar1 = -dVar1;
              }
              if (dVar1 <= 0.5) goto LAB_0010fc87;
              global = lVar9 - local_60;
              if (lVar9 < local_60) {
                puts("not expecting less than half, unless unit test");
                lVar9 = -1;
                if ((lVar14 < ref_node->max) && (lVar9 = ref_node->global[lVar14], lVar9 < 0)) {
                  lVar9 = -1;
                }
                global = lVar9 + local_60;
              }
              uVar5 = ref_node_local(ref_node,global,(REF_INT *)((long)__ptr + lVar7));
              if (uVar5 != 0) {
                pcVar10 = "localize";
                uVar8 = 0x42;
                goto LAB_0010fda0;
              }
              if (ref_node->ref_mpi->id == ref_node->part[lVar14]) {
                uVar5 = ref_node_remove(ref_node,RVar11);
                if (uVar5 != 0) {
                  pcVar10 = "remove";
                  uVar8 = 0x45;
                  goto LAB_0010fda0;
                }
              }
              else {
                uVar5 = ref_node_remove_without_global(ref_node,RVar11);
                if (uVar5 != 0) {
                  pcVar10 = "remove";
                  uVar8 = 0x47;
                  goto LAB_0010fda0;
                }
              }
            }
            iVar12 = ref_node->max;
            lVar9 = (long)iVar12;
            if ((lVar14 < lVar9) && (-1 < ref_node->global[lVar14])) {
              pRVar2 = ref_node->real;
              dVar1 = pRVar2[lVar13];
              if (dVar1 <= -dVar1) {
                dVar1 = -dVar1;
              }
              if (0.5 < dVar1) {
                auVar16._0_8_ = pRVar2[lVar13 + 1] * 0.017452406437283494;
                auVar16._8_8_ = pRVar2[lVar13 + 1] * 0.9998476951563913;
                *(undefined1 (*) [16])(pRVar2 + lVar13) = auVar16;
              }
            }
          }
          lVar14 = lVar14 + 1;
          lVar7 = lVar7 + 4;
          lVar13 = lVar13 + 0xf;
        } while (lVar14 < lVar9);
      }
      uVar5 = ref_node_synchronize_globals(ref_node);
      if (uVar5 == 0) {
        pRVar3 = local_90->cell[3];
        if (0 < pRVar3->max) {
          RVar11 = 0;
          do {
            RVar6 = ref_cell_nodes(pRVar3,RVar11,local_88);
            if (RVar6 == 0) {
              lVar7 = 0;
              do {
                local_e8[lVar7] = *(uint *)((long)__ptr + (long)local_88[lVar7] * 4);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 3);
              local_e8[3] = local_88[3];
              uVar5 = ref_cell_replace_whole(pRVar3,RVar11,(REF_INT *)local_e8);
              if (uVar5 != 0) {
                pcVar10 = "renum";
                uVar8 = 0x5b;
                goto LAB_0010fda0;
              }
            }
            RVar11 = RVar11 + 1;
          } while (RVar11 < pRVar3->max);
        }
        pRVar4 = local_90;
        pRVar3 = local_90->cell[6];
        if (0 < pRVar3->max) {
          RVar11 = 0;
          do {
            RVar6 = ref_cell_nodes(pRVar3,RVar11,local_88);
            if (RVar6 == 0) {
              lVar7 = 0;
              do {
                local_e8[lVar7] = *(uint *)((long)__ptr + (long)local_88[lVar7] * 4);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 4);
              local_e8[4] = local_88[4];
              uVar5 = ref_sort_unique_int(4,(REF_INT *)local_e8,&local_10c,local_58);
              if (uVar5 != 0) {
                pcVar10 = "uniq";
                uVar8 = 99;
                goto LAB_0010fda0;
              }
              if (local_10c < 4) {
                uVar5 = ref_cell_remove(pRVar3,RVar11);
                if (uVar5 != 0) {
                  pcVar10 = "rm qua";
                  uVar8 = 100;
                  goto LAB_0010fda0;
                }
                if (local_10c == 3) {
                  if (local_e8[2] == local_e8[3]) {
                    local_e8[3] = local_e8[4];
                  }
                  uVar5 = local_e8[3];
                  if (local_e8[1] == local_e8[2]) {
                    local_e8[3] = local_e8[4];
                    local_e8[2] = uVar5;
                  }
                  uVar5 = local_e8[3];
                  if (local_e8[0] == local_e8[1]) {
                    local_e8[3] = local_e8[4];
                    local_e8[1] = local_e8[2];
                    local_e8[2] = uVar5;
                  }
                  uVar5 = local_e8[2];
                  if (local_e8[3] == local_e8[0]) {
                    local_e8[2] = local_e8[0];
                    local_e8[3] = local_e8[4];
                    local_e8[0] = local_e8[1];
                    local_e8[1] = uVar5;
                  }
                  uVar5 = ref_cell_add(pRVar4->cell[3],(REF_INT *)local_e8,&local_bc);
                  if (uVar5 != 0) {
                    pcVar10 = "new cell";
                    uVar8 = 0x79;
                    goto LAB_0010fda0;
                  }
                }
              }
              if (local_10c == 4) {
                lVar7 = 0;
                do {
                  local_e8[lVar7] = *(uint *)((long)__ptr + (long)local_88[lVar7] * 4);
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 4);
                local_e8[4] = local_88[4];
                uVar5 = ref_cell_replace_whole(pRVar3,RVar11,(REF_INT *)local_e8);
                if (uVar5 != 0) {
                  pcVar10 = "renum";
                  uVar8 = 0x7e;
                  goto LAB_0010fda0;
                }
              }
            }
            RVar11 = RVar11 + 1;
          } while (RVar11 < pRVar3->max);
        }
        pRVar3 = pRVar4->cell[10];
        if (0 < pRVar3->max) {
          RVar11 = 0;
          do {
            RVar6 = ref_cell_nodes(pRVar3,RVar11,local_88);
            if (RVar6 == 0) {
              lVar7 = 0;
              do {
                local_e8[lVar7] = *(uint *)((long)__ptr + (long)local_88[lVar7] * 4);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 6);
              uVar5 = ref_sort_unique_int(6,(REF_INT *)local_e8,&local_10c,local_58);
              if (uVar5 != 0) {
                pcVar10 = "uniq";
                uVar8 = 0x86;
                goto LAB_0010fda0;
              }
              if (local_10c < 6) {
                uVar5 = ref_cell_remove(pRVar3,RVar11);
                if (uVar5 != 0) {
                  pcVar10 = "rm qua";
                  uVar8 = 0x87;
                  goto LAB_0010fda0;
                }
                if (local_10c == 5) {
                  if (local_e8[0] == local_e8[3]) {
                    local_b8 = local_e8[1];
                    local_b4 = local_e8[2];
                    local_b0 = local_e8[0];
                    local_ac = local_e8[4];
                    local_a8 = local_e8[5];
                  }
                  if (local_e8[1] == local_e8[4]) {
                    local_b8 = local_e8[2];
                    local_b4 = local_e8[0];
                    local_b0 = local_e8[1];
                    local_ac = local_e8[5];
                    local_a8 = local_e8[3];
                  }
                  if (local_e8[2] == local_e8[5]) {
                    local_b8 = local_e8[0];
                    local_b4 = local_e8[1];
                    local_b0 = local_e8[2];
                    local_ac = local_e8[3];
                    local_a8 = local_e8[4];
                  }
                  uVar5 = ref_cell_add(pRVar4->cell[9],(REF_INT *)&local_b8,&local_bc);
                  if (uVar5 != 0) {
                    pcVar10 = "new cell";
                    uVar8 = 0x9f;
                    goto LAB_0010fda0;
                  }
                }
                if (local_10c == 4) {
                  if (local_e8[1] != local_e8[4]) {
                    local_e8[3] = local_e8[4];
                  }
                  if (local_e8[2] != local_e8[5]) {
                    local_e8[3] = local_e8[5];
                  }
                  uVar5 = ref_cell_add(pRVar4->cell[8],(REF_INT *)local_e8,&local_bc);
                  if (uVar5 != 0) {
                    pcVar10 = "new cell";
                    uVar8 = 0xa5;
                    goto LAB_0010fda0;
                  }
                }
              }
            }
            RVar11 = RVar11 + 1;
          } while (RVar11 < pRVar3->max);
        }
        pRVar3 = pRVar4->cell[0xb];
        if (0 < pRVar3->max) {
          iVar12 = 0;
          do {
            RVar6 = ref_cell_nodes(pRVar3,iVar12,local_88);
            if (RVar6 == 0) {
              lVar7 = 0;
              do {
                local_e8[lVar7] = *(uint *)((long)__ptr + (long)local_88[lVar7] * 4);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 8);
              uVar5 = ref_sort_unique_int(8,(REF_INT *)local_e8,&local_10c,local_58);
              if (uVar5 != 0) {
                pcVar10 = "uniq";
                uVar8 = 0xad;
                goto LAB_0010fda0;
              }
              if (local_10c != 8) {
                if (local_10c < 8) {
                  uVar5 = ref_cell_remove(pRVar3,iVar12);
                  if (uVar5 != 0) {
                    pcVar10 = "rm qua";
                    uVar8 = 0xaf;
                    goto LAB_0010fda0;
                  }
                  if (local_10c == 6) {
                    local_108 = 0xffffffff;
                    if ((local_e8[0] == local_e8[1]) && (local_e8[4] == local_e8[5])) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[2];
                      local_100 = local_e8[3];
                      local_fc = local_e8[4];
                      local_f8 = local_e8[6];
                      local_f4 = local_e8[7];
                    }
                    if (local_e8[1] == local_e8[5] && (local_e8[0] ^ local_e8[4]) == 0) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[3];
                      local_100 = local_e8[7];
                      local_fc = local_e8[1];
                      local_f8 = local_e8[2];
                      local_f4 = local_e8[6];
                    }
                    if ((local_e8[1] == local_e8[2]) && (local_e8[5] == local_e8[6])) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[1];
                      local_100 = local_e8[3];
                      local_fc = local_e8[4];
                      local_f8 = local_e8[5];
                      local_f4 = local_e8[7];
                    }
                    if ((local_e8[1] == local_e8[5]) && (local_e8[2] == local_e8[6])) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[4];
                      local_100 = local_e8[1];
                      local_fc = local_e8[0];
                      local_f8 = local_e8[7];
                      local_f4 = local_e8[6];
                    }
                    if ((local_e8[3] == local_e8[7]) && (local_e8[2] == local_e8[6])) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[7];
                      local_100 = local_e8[4];
                      local_fc = local_e8[1];
                      local_f8 = local_e8[6];
                      local_f4 = local_e8[5];
                    }
                    if ((local_e8[3] == local_e8[2]) && (local_e8[7] == local_e8[6])) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[1];
                      local_100 = local_e8[2];
                      local_fc = local_e8[4];
                      local_f8 = local_e8[5];
                      local_f4 = local_e8[6];
                    }
                    if ((local_e8[0] ^ local_e8[4]) == 0 && local_e8[3] == local_e8[7]) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[5];
                      local_100 = local_e8[1];
                      local_fc = local_e8[7];
                      local_f8 = local_e8[6];
                      local_f4 = local_e8[1];
                    }
                    if ((local_e8[0] ^ local_e8[3]) == 0 && (local_e8[4] ^ local_e8[7]) == 0) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[1];
                      local_100 = local_e8[2];
                      local_fc = local_e8[4];
                      local_f8 = local_e8[5];
                      local_f4 = local_e8[6];
                    }
                    if (local_e8[0] == local_e8[1] && local_e8[3] == local_e8[2]) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[4];
                      local_100 = local_e8[5];
                      local_fc = local_e8[2];
                      local_f8 = local_e8[7];
                      local_f4 = local_e8[6];
                    }
                    if (local_e8[1] == local_e8[2] && (local_e8[0] ^ local_e8[3]) == 0) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[7];
                      local_100 = local_e8[4];
                      local_fc = local_e8[1];
                      local_f8 = local_e8[6];
                      local_f4 = local_e8[5];
                    }
                    if ((local_e8[4] == local_e8[5]) && (local_e8[7] == local_e8[6])) {
                      local_108 = local_e8[0];
                      local_104 = local_e8[4];
                      local_100 = local_e8[1];
                      local_fc = local_e8[0];
                      local_f8 = local_e8[6];
                      local_f4 = local_e8[2];
                    }
                    if ((local_e8[4] ^ local_e8[7]) == 0 && local_e8[6] == local_e8[5]) {
                      local_108 = local_e8[1];
                      local_104 = local_e8[5];
                      local_100 = local_e8[2];
                      local_fc = local_e8[0];
                      local_f8 = local_e8[4];
                      local_f4 = local_e8[3];
                    }
                    uVar5 = ref_cell_add(local_90->cell[10],(REF_INT *)&local_108,&local_bc);
                    if (uVar5 == 0) goto LAB_00110446;
                    pcVar10 = "new cell";
                    uVar8 = 0x126;
                    goto LAB_0010fda0;
                  }
                }
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0xb0,"ref_axi_wedge","expected 6 unique hex nodes on pole",6,(long)local_10c
                      );
                goto LAB_0010fd6a;
              }
            }
LAB_00110446:
            iVar12 = iVar12 + 1;
          } while (iVar12 < pRVar3->max);
        }
        free(__ptr);
        uVar5 = 0;
      }
      else {
        pcVar10 = "sync";
        uVar8 = 0x54;
LAB_0010fda0:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",uVar8
               ,"ref_axi_wedge",(ulong)uVar5,pcVar10);
      }
    }
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_axi_wedge(REF_GRID ref_grid) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL pole_tol;
  REF_INT *o2n, node;
  REF_GLOB nhalf, global;

  REF_INT cell, nodes[8], new_nodes[8], pyr_nodes[8], pri_nodes[8];
  REF_INT nunique, unique[8];
  REF_INT new_cell;

  REF_DBL radius, wedge_angle;

  ref_node = ref_grid_node(ref_grid);

  ref_malloc_init(o2n, ref_node_n(ref_node), REF_INT, REF_EMPTY);

  pole_tol = 1.0e-6; /* drop to smaller number */
  wedge_angle = ref_math_in_radians(1.0);

  /* make half logic globals, RCB can scrambles local indexes */
  nhalf = ref_node_n_global(ref_node) / 2;
  each_ref_node_valid_node(ref_node, node) {
    if (ABS(ref_node_xyz(ref_node, 2, node)) < pole_tol &&
        ABS(ref_node_xyz(ref_node, 1, node)) > 0.5) {
      if (ref_node_global(ref_node, node) < nhalf) {
        printf("not expecting less than half, unless unit test\n");
        global = ref_node_global(ref_node, node) + nhalf;
      } else {
        /* set to pair on plane that is kept */
        global = ref_node_global(ref_node, node) - nhalf;
      }
      RSS(ref_node_local(ref_node, global, &(o2n[node])), "localize");
      /* remove if you own it, remove without global if you don't own it */
      if (ref_node_owned(ref_node, node)) {
        RSS(ref_node_remove(ref_node, node), "remove");
      } else {
        RSS(ref_node_remove_without_global(ref_node, node), "remove");
      }
    } else {
      o2n[node] = node;
    }
    if (ref_node_valid(ref_node, node) && /* ignore collapsed nodes */
        ABS(ref_node_xyz(ref_node, 1, node)) > 0.5) {
      radius = ref_node_xyz(ref_node, 2, node);
      ref_node_xyz(ref_node, 1, node) = radius * sin(wedge_angle);
      ref_node_xyz(ref_node, 2, node) = radius * cos(wedge_angle);
    }
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 3; node++) new_nodes[node] = o2n[nodes[node]];
    new_nodes[3] = nodes[3];
    RSS(ref_cell_replace_whole(ref_cell, cell, new_nodes), "renum");
  }

  ref_cell = ref_grid_qua(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 4; node++) new_nodes[node] = o2n[nodes[node]];
    new_nodes[4] = nodes[4];
    RSS(ref_sort_unique_int(4, new_nodes, &nunique, unique), "uniq");
    if (4 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    if (3 == nunique) {
      if (new_nodes[2] == new_nodes[3]) {
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[1] == new_nodes[2]) {
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[0] == new_nodes[1]) {
        new_nodes[1] = new_nodes[2];
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[3] == new_nodes[0]) {
        new_nodes[0] = new_nodes[1];
        new_nodes[1] = new_nodes[2];
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell),
          "new cell");
    }
    if (4 == nunique) {
      for (node = 0; node < 4; node++) new_nodes[node] = o2n[nodes[node]];
      new_nodes[4] = nodes[4];
      RSS(ref_cell_replace_whole(ref_cell, cell, new_nodes), "renum");
    }
  }

  ref_cell = ref_grid_pri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 6; node++) new_nodes[node] = o2n[nodes[node]];
    RSS(ref_sort_unique_int(6, new_nodes, &nunique, unique), "uniq");
    if (6 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    if (5 == nunique) {
      if (new_nodes[0] == new_nodes[3]) {
        pyr_nodes[0] = new_nodes[1];
        pyr_nodes[1] = new_nodes[2];
        pyr_nodes[2] = new_nodes[0];
        pyr_nodes[3] = new_nodes[4];
        pyr_nodes[4] = new_nodes[5];
      }
      if (new_nodes[1] == new_nodes[4]) {
        pyr_nodes[0] = new_nodes[2];
        pyr_nodes[1] = new_nodes[0];
        pyr_nodes[2] = new_nodes[1];
        pyr_nodes[3] = new_nodes[5];
        pyr_nodes[4] = new_nodes[3];
      }
      if (new_nodes[2] == new_nodes[5]) {
        pyr_nodes[0] = new_nodes[0];
        pyr_nodes[1] = new_nodes[1];
        pyr_nodes[2] = new_nodes[2];
        pyr_nodes[3] = new_nodes[3];
        pyr_nodes[4] = new_nodes[4];
      }
      RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_cell),
          "new cell");
    }
    if (4 == nunique) {
      if (new_nodes[1] != new_nodes[4]) new_nodes[3] = new_nodes[4];
      if (new_nodes[2] != new_nodes[5]) new_nodes[3] = new_nodes[5];
      RSS(ref_cell_add(ref_grid_tet(ref_grid), new_nodes, &new_cell),
          "new cell");
    }
  }

  ref_cell = ref_grid_hex(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 8; node++) new_nodes[node] = o2n[nodes[node]];
    RSS(ref_sort_unique_int(8, new_nodes, &nunique, unique), "uniq");
    if (8 == nunique) continue;
    if (8 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    REIS(6, nunique, "expected 6 unique hex nodes on pole");
    if (6 == nunique) {
      pri_nodes[0] = REF_EMPTY;

      /* 0: 0 4 5 1 */
      if (new_nodes[0] == new_nodes[1] && new_nodes[4] == new_nodes[5]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[2];
        pri_nodes[2] = new_nodes[3];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[7];
      }
      if (new_nodes[0] == new_nodes[4] && new_nodes[1] == new_nodes[5]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[3];
        pri_nodes[2] = new_nodes[7];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[2];
        pri_nodes[5] = new_nodes[6];
      }

      /* 1: 1 5 6 2 */
      if (new_nodes[1] == new_nodes[2] && new_nodes[5] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[3];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[7];
      }
      if (new_nodes[1] == new_nodes[5] && new_nodes[2] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[2];
      }

      /* 2: 2 6 7 3 */
      if (new_nodes[3] == new_nodes[7] && new_nodes[2] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[3];
        pri_nodes[2] = new_nodes[4];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[2];
        pri_nodes[5] = new_nodes[5];
      }
      if (new_nodes[3] == new_nodes[2] && new_nodes[7] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[6];
      }

      /* 3: 0 3 7 4 */
      if (new_nodes[0] == new_nodes[4] && new_nodes[3] == new_nodes[7]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[5];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[3];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[1];
      }
      if (new_nodes[0] == new_nodes[3] && new_nodes[4] == new_nodes[7]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[6];
      }

      /* 4: 0 1 2 3 */
      if (new_nodes[0] == new_nodes[1] && new_nodes[3] == new_nodes[2]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[5];
        pri_nodes[3] = new_nodes[3];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[6];
      }
      if (new_nodes[0] == new_nodes[3] && new_nodes[1] == new_nodes[2]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[7];
        pri_nodes[2] = new_nodes[4];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[5];
      }

      /* 5: 4 7 6 5 */
      if (new_nodes[4] == new_nodes[5] && new_nodes[7] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[2];
      }
      if (new_nodes[4] == new_nodes[7] && new_nodes[5] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[1];
        pri_nodes[1] = new_nodes[5];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[4];
        pri_nodes[5] = new_nodes[3];
      }

      /*
      printf(" new %d %d %d %d    %d %d %d %d\n", new_nodes[0], new_nodes[1],
             new_nodes[2], new_nodes[3], new_nodes[4], new_nodes[5],
             new_nodes[6], new_nodes[7]);
             */
      RSS(ref_cell_add(ref_grid_pri(ref_grid), pri_nodes, &new_cell),
          "new cell");
    }
  }

  ref_free(o2n);

  return REF_SUCCESS;
}